

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O2

int os_system_linux_linux_get_ioctl_fd(int af_type)

{
  if (af_type == 10) {
    return _ioctl_v6;
  }
  if (af_type == 2) {
    return _ioctl_v4;
  }
  return -1;
}

Assistant:

int
os_system_linux_linux_get_ioctl_fd(int af_type) {
  switch (af_type) {
    case AF_INET:
      return _ioctl_v4;
    case AF_INET6:
      return _ioctl_v6;
    default:
      return -1;
  }
}